

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

bool __thiscall cppforth::Forth::interpretNumbers(Forth *this,string *value)

{
  int iVar1;
  size_type sVar2;
  bool bVar3;
  Cell CVar4;
  unsigned_long uVar5;
  byte *pbVar6;
  int *piVar7;
  undefined8 uVar8;
  Cell numericBase;
  byte *pbVar9;
  byte *pbVar10;
  byte bVar11;
  byte bVar12;
  const_iterator cVar13;
  uint x;
  byte *__nptr;
  unsigned_long uVar14;
  double x_00;
  const_iterator returnValue;
  const_iterator local_38;
  
  CVar4 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
  __nptr = (byte *)(value->_M_dataplus)._M_p;
  sVar2 = value->_M_string_length;
  if (sVar2 == 0) goto LAB_0012c49f;
  if (__nptr[sVar2 - 1] == 0x2e) {
LAB_0012c40e:
    if (sVar2 == 1) goto LAB_0012c49f;
    if (__nptr[sVar2 - 1] == 0x2e) {
      cVar13._M_current = (char *)(__nptr + (value->_M_string_length - 1));
      bVar12 = *__nptr;
      if ((byte)(bVar12 - 0x23) < 3) {
        CVar4 = *(Cell *)(&DAT_00132d00 + (ulong)(byte)(bVar12 - 0x23) * 4);
        bVar12 = __nptr[1];
        __nptr = __nptr + 1;
      }
      local_38._M_current = (char *)(__nptr + (bVar12 == 0x2d));
      uVar5 = parseUnsignedNumber(local_38,cVar13,&local_38,CVar4);
      if (local_38._M_current != cVar13._M_current) {
        __nptr = (byte *)(value->_M_dataplus)._M_p;
        goto LAB_0012c480;
      }
      uVar14 = -uVar5;
      if (bVar12 != 0x2d) {
        uVar14 = uVar5;
      }
      CVar4 = dataSpaceAtCell(this,this->VarOffsetState);
      x = (uint)(uVar14 >> 0x20);
      if (CVar4 == 0) {
        ForthStack<unsigned_int>::push(&this->dStack,(Cell)uVar14);
        goto LAB_0012c6bb;
      }
      data(this,1);
      data(this,(Cell)uVar14);
      data(this,1);
      goto LAB_0012c613;
    }
LAB_0012c480:
    if (sVar2 == 3) {
      bVar12 = *__nptr;
      if (bVar12 == 0x27) {
        if (__nptr[2] == 0x27) {
          x = (uint)__nptr[1];
          goto LAB_0012c582;
        }
        goto LAB_0012c49f;
      }
    }
    else {
LAB_0012c49f:
      bVar12 = *__nptr;
    }
    pbVar6 = __nptr + value->_M_string_length;
    if ((bVar12 == 0x2b) || (pbVar10 = __nptr, bVar12 == 0x2d)) {
      pbVar10 = __nptr + 1;
    }
    pbVar9 = pbVar10;
    if (pbVar10 < pbVar6) {
      do {
        if (9 < (byte)(*pbVar9 - 0x30)) break;
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != pbVar6);
      if (pbVar9 < pbVar6 && pbVar10 < pbVar9) {
        if ((*pbVar9 == 0x2e) && (pbVar9 = pbVar9 + 1, pbVar9 < pbVar6)) {
          do {
            if (9 < (byte)(*pbVar9 - 0x30)) break;
            pbVar9 = pbVar9 + 1;
          } while (pbVar9 != pbVar6);
        }
        if ((pbVar9 < pbVar6) && ((*pbVar9 & 0xdf) == 0x45)) {
          pbVar10 = pbVar9 + 1;
          if (pbVar10 < pbVar6) {
            if ((*pbVar10 == 0x2b) || (*pbVar10 == 0x2d)) {
              pbVar10 = pbVar9 + 2;
            }
            if (pbVar10 < pbVar6) {
              do {
                if (9 < (byte)(*pbVar10 - 0x30)) goto LAB_0012c61d;
                pbVar10 = pbVar10 + 1;
              } while (pbVar10 != pbVar6);
            }
            else {
LAB_0012c61d:
              if (pbVar10 != pbVar6) goto LAB_0012c622;
            }
          }
          piVar7 = __errno_location();
          iVar1 = *piVar7;
          *piVar7 = 0;
          x_00 = strtod((char *)__nptr,&local_38._M_current);
          if ((byte *)local_38._M_current == __nptr) {
            uVar8 = std::__throw_invalid_argument("stod");
            if (*piVar7 == 0) {
              *piVar7 = iVar1;
            }
            _Unwind_Resume(uVar8);
          }
          if (*piVar7 == 0) {
LAB_0012c671:
            *piVar7 = iVar1;
          }
          else if (*piVar7 == 0x22) {
            std::__throw_out_of_range("stod");
            goto LAB_0012c671;
          }
          CVar4 = dataSpaceAtCell(this,this->VarOffsetState);
          if (CVar4 == 0) {
            ForthStack<double>::push(&this->fStack,x_00);
          }
          else {
            data(this,0x12);
            dataFloat(this,x_00);
          }
          goto LAB_0012c6c0;
        }
      }
    }
LAB_0012c622:
    bVar3 = false;
  }
  else {
    cVar13._M_current = (char *)(__nptr + sVar2);
    bVar11 = *__nptr;
    bVar12 = bVar11 - 0x23;
    numericBase = CVar4;
    if (bVar12 < 3) {
      bVar11 = __nptr[1];
      __nptr = __nptr + 1;
      numericBase = *(Cell *)(&DAT_00132d00 + (ulong)bVar12 * 4);
    }
    local_38._M_current = (char *)(__nptr + (bVar11 == 0x2d));
    uVar5 = parseUnsignedNumber(local_38,cVar13,&local_38,numericBase);
    if (local_38._M_current != cVar13._M_current) {
      __nptr = (byte *)(value->_M_dataplus)._M_p;
      goto LAB_0012c40e;
    }
    x = -(uint)uVar5;
    if (bVar11 != 0x2d) {
      x = (uint)uVar5;
    }
LAB_0012c582:
    CVar4 = dataSpaceAtCell(this,this->VarOffsetState);
    if (CVar4 == 0) {
LAB_0012c6bb:
      ForthStack<unsigned_int>::push(&this->dStack,x);
    }
    else {
      data(this,1);
LAB_0012c613:
      data(this,x);
    }
LAB_0012c6c0:
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool interpretNumbers(const std::string &value){
			int base = getNumericBase();
			auto valueSize=value.length();
			bool signNegative{};
			long long numericIntValue{};
			// consider it is signed int
			if(valueSize>0 && value[valueSize-1]!='.'){
				auto begin=value.begin();
				auto end=value.end();
				auto localBase=base;
				auto firstChar=*begin;
				if(firstChar=='#') {localBase=10; ++begin;}
				else if(firstChar=='$') {localBase=16; ++begin;}
				else if(firstChar=='%') {localBase=2; ++begin;}
				firstChar=*begin;
				if(firstChar=='-') {signNegative=true; ++begin;}
				else {signNegative=false;};
				auto returnValue{begin};
				numericIntValue=parseUnsignedNumber(begin,end,returnValue,localBase);
				if(returnValue==end){
					if(signNegative) numericIntValue=-numericIntValue;
					int numberInt{static_cast<int>(numericIntValue)};
					if (getIsCompiling()) {
						data(CELL(doLiteralXt));
						data(numberInt);
					}
					else {
						push(numberInt);
					}
					return true;
				}
			}

			// consider it is double int
			if(valueSize>1 && value[valueSize-1]=='.'){
				auto begin=value.begin();
				auto end=value.end()-1;
				auto localBase=base;
				auto firstChar=*begin;
				if(firstChar=='#') {localBase=10; ++begin;}
				else if(firstChar=='$') {localBase=16; ++begin;}
				else if(firstChar=='%') {localBase=2; ++begin;}
				firstChar=*begin;
				if(firstChar=='-') {signNegative=true; ++begin;}
				else {signNegative=false;};
				auto returnValue{begin};
				numericIntValue=parseUnsignedNumber(begin,end,returnValue,localBase);
				if(returnValue==end){
					if(signNegative) numericIntValue=-numericIntValue;
					SDCell numberD(numericIntValue);
					if (getIsCompiling()) {
						data(CELL(doLiteralXt));
						data(numberD.data_.Cells.lo);
						data(CELL(doLiteralXt));
						data(numberD.data_.Cells.hi);
					}
					else {
						push(numberD.data_.Cells.lo);
						push(numberD.data_.Cells.hi);
					}
					return true;
				}

			}
			// consider it is char
			if (valueSize==3 && value[0]=='\'' and value[2]=='\''){
				unsigned number;
				number = static_cast<unsigned char>(value[1]);
				if (getIsCompiling()) {
					data(CELL(doLiteralXt));
					data(number);
				}
				else {
					push(number);
				}
				return true;
			}			
#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT
/*
if(0){
			std::smatch m1{};
			bool found{};
			static std::regex regexFloat{ "^[-+]?(([0-9]*[\\.]{0,1}[0-9]+)|([0-9]+[\\.]{0,1}[0-9]*))([eE][-+]?[0-9]*)?$" };
			found = regex_search(value, m1, regexFloat);
			if (found){
				FCell number = std::stod(value);
				if (getIsCompiling()) {
					data(CELL(doFLiteralXt));
					dataFloat(number);
				}
				else {
					fStack.push(number);
				}
				return true;
			}
} else
*/
 			{
				// used for own calculation of value without library function
				//long long significandDigits{},exponentDigits0{};
				//double significandDigits0{};
				bool signNegative{},exponentSignNegative{};
				auto begin=value.begin();
				auto end=value.end();
				auto firstChar=*begin;
				if(firstChar=='-') { signNegative=true; ++begin;}
				else if(firstChar=='+') {signNegative=false; ++begin;}
				auto returnValue{begin};
				// own calculation: significandDigits=parseUnsignedNumber(begin,end,returnValue,10);
				skipDecimalDigits(begin,end,returnValue);
				if(returnValue>begin && returnValue<end){ // value has at least 1 decimal digit
					firstChar=*returnValue;
					if(firstChar=='.'){
						begin=++returnValue;
						// own calculation: significandDigits0=parseUnsignedNumberAsFloat(begin,end,returnValue,10);
						skipDecimalDigits(begin,end,returnValue);
					}
					if(returnValue<end){
						firstChar=*returnValue++;
						if(firstChar=='E' || firstChar=='e'){
							if(returnValue<end){
								firstChar=*returnValue;
								if(firstChar=='-') { exponentSignNegative=true; ++returnValue;}
								else if(firstChar=='+') {exponentSignNegative=false; ++returnValue;}
								begin=returnValue;
								// own calculation: exponentDigits0=parseUnsignedNumber(begin,end,returnValue,10);
								skipDecimalDigits(begin,end,returnValue);
								if(returnValue!=end){
									return false;
								}
								// own calculation: if(exponentSignNegative) exponentDigits0=-exponentDigits0;
							}
							// pattern matched
							// convert numbers to digits;
							
							// own calculation: double significant1=significandDigits;
							// own calculation: significant1+=significandDigits0;
							// own calculation: significant1*=std::pow(10,exponentDigits0);
							// own calculation: if(signNegative) significant1=-significant1;
							
							// standard library function provides better precision
							double significantStd=std::stod(value);
							//if(significant1!=significantStd){static int cnt=0;
							//std::cerr <<++cnt<<" Value "<<value<<" My "<<std::setprecision(20)<<significant1<< " , STD "<<std::setprecision(20)<<significantStd 
							//<<" Diff " <<(significant1-significantStd) 
							//<<std::endl;
							//}
							FCell number = significantStd;
							if (getIsCompiling()) {
								data(CELL(doFLiteralXt));
								dataFloat(number);
							}
							else {
								fStack.push(number);
							}
							return true;


						}
					}
				}
			}

#endif
			return false;
}